

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FArrayBox.H
# Opt level: O3

bool __thiscall
amrex::FArrayBox::contains_nan<(amrex::RunOn)1>
          (FArrayBox *this,Box *bx,int scomp,int ncomp,IntVect *where)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  double *pdVar12;
  double *pdVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  double *pdVar18;
  double *pdVar19;
  
  if (ncomp < 1) {
    return false;
  }
  iVar10 = (this->super_BaseFab<double>).domain.smallend.vect[0];
  iVar1 = (this->super_BaseFab<double>).domain.smallend.vect[1];
  iVar2 = (this->super_BaseFab<double>).domain.smallend.vect[2];
  lVar9 = (long)(((this->super_BaseFab<double>).domain.bigend.vect[0] - iVar10) + 1);
  lVar14 = (long)(((this->super_BaseFab<double>).domain.bigend.vect[1] - iVar1) + 1);
  lVar15 = (long)(((this->super_BaseFab<double>).domain.bigend.vect[2] - iVar2) + 1);
  iVar3 = (bx->bigend).vect[2];
  iVar4 = (bx->bigend).vect[0];
  iVar5 = (bx->smallend).vect[2];
  lVar11 = (long)scomp;
  iVar6 = (bx->bigend).vect[1];
  iVar7 = (bx->smallend).vect[1];
  iVar8 = (bx->smallend).vect[0];
  pdVar12 = (double *)
            ((((long)iVar5 * 8 + lVar11 * lVar15 * 8 + (long)iVar2 * -8) * lVar14 + (long)iVar7 * 8
             + (long)iVar1 * -8) * lVar9 + (long)iVar8 * 8 + (long)iVar10 * -8 +
            (long)(this->super_BaseFab<double>).dptr);
  lVar14 = lVar14 * lVar9;
  do {
    lVar16 = (long)iVar5;
    pdVar19 = pdVar12;
    if (iVar5 <= iVar3) {
      do {
        pdVar13 = pdVar19;
        lVar17 = (long)iVar7;
        if (iVar7 <= iVar6) {
          do {
            pdVar18 = pdVar13;
            iVar10 = iVar8;
            if (iVar8 <= iVar4) {
              do {
                if (NAN(*pdVar18)) {
                  where->vect[0] = iVar10;
                  where->vect[1] = (int)lVar17;
                  where->vect[2] = (int)lVar16;
                  return true;
                }
                iVar10 = iVar10 + 1;
                pdVar18 = pdVar18 + 1;
              } while (iVar4 + 1 != iVar10);
            }
            lVar17 = lVar17 + 1;
            pdVar13 = pdVar13 + lVar9;
          } while (iVar6 + 1 != (int)lVar17);
        }
        lVar16 = lVar16 + 1;
        pdVar19 = pdVar19 + lVar14;
      } while (iVar3 + 1 != (int)lVar16);
    }
    lVar11 = lVar11 + 1;
    pdVar12 = pdVar12 + lVar15 * lVar14;
  } while (lVar11 < ncomp + scomp);
  return false;
}

Assistant:

bool
FArrayBox::contains_nan (const Box& bx, int scomp, int ncomp, IntVect& where) const noexcept
{
    BL_ASSERT(scomp >= 0);
    BL_ASSERT(ncomp >= 1);
    BL_ASSERT(scomp <  nComp());
    BL_ASSERT(ncomp <= nComp());
    BL_ASSERT(domain.contains(bx));

    const auto& a = this->array();
#ifdef AMREX_USE_GPU
    if (run_on == RunOn::Device && Gpu::inLaunchRegion()) {
        Array<int,1+AMREX_SPACEDIM> ha{0,AMREX_D_DECL(std::numeric_limits<int>::lowest(),
                                                      std::numeric_limits<int>::lowest(),
                                                      std::numeric_limits<int>::lowest())};
        Gpu::DeviceVector<int> dv(1+AMREX_SPACEDIM);
        int* p = dv.data();
        Gpu::htod_memcpy_async(p, ha.data(), sizeof(int)*ha.size());
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
        {
            int* flag = p;
            bool t = false;
            for (int n = scomp; n < scomp+ncomp; ++n) {
                t = t || amrex::isnan(a(i,j,k,n));
            }
            if (t && (*flag == 0)) {
                if (Gpu::Atomic::Exch(flag,1) == 0) {
                    AMREX_D_TERM(p[1] = i;,
                                 p[2] = j;,
                                 p[3] = k;);
                }
            }
        });
        Gpu::dtoh_memcpy_async(ha.data(), p, sizeof(int)*ha.size());
        Gpu::streamSynchronize();
        where = IntVect(AMREX_D_DECL(ha[1],ha[2],ha[3]));
        return ha[0];
    } else
#endif
    {
        const auto lo = amrex::lbound(bx);
        const auto hi = amrex::ubound(bx);
        for (int n = scomp; n < scomp+ncomp; ++n) {
            for         (int k = lo.z; k <= hi.z; ++k) {
                for     (int j = lo.y; j <= hi.y; ++j) {
                    for (int i = lo.x; i <= hi.x; ++i) {
                        if (amrex::isnan(a(i,j,k,n))) {
                            where = IntVect(AMREX_D_DECL(i,j,k));
                            return true;
                        }
                    }
                }
            }
        }
        return false;
    }
}